

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sqclosure.h
# Opt level: O3

SQNativeClosure * __thiscall SQNativeClosure::Clone(SQNativeClosure *this)

{
  SQUnsignedInteger *pSVar1;
  long *plVar2;
  SQObjectType SVar3;
  SQObjectType SVar4;
  uint uVar5;
  uint uVar6;
  SQWeakRef *pSVar7;
  SQTable *pSVar8;
  SQTable *pSVar9;
  SQObjectPtr *pSVar10;
  SQObjectPtr *pSVar11;
  long *plVar12;
  long lVar13;
  SQNativeClosure *pSVar14;
  EVP_PKEY_CTX *src;
  EVP_PKEY_CTX *extraout_RDX;
  EVP_PKEY_CTX *extraout_RDX_00;
  long lVar15;
  long lVar16;
  
  pSVar14 = Create((this->super_SQCollectable)._sharedstate,this->_function,this->_noutervalues);
  pSVar7 = this->_env;
  pSVar14->_env = pSVar7;
  if (pSVar7 != (SQWeakRef *)0x0) {
    pSVar1 = &(pSVar7->super_SQRefCounted)._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  SVar3 = (pSVar14->_name).super_SQObject._type;
  pSVar8 = (pSVar14->_name).super_SQObject._unVal.pTable;
  pSVar9 = (this->_name).super_SQObject._unVal.pTable;
  (pSVar14->_name).super_SQObject._unVal.pTable = pSVar9;
  SVar4 = (this->_name).super_SQObject._type;
  src = (EVP_PKEY_CTX *)(ulong)SVar4;
  (pSVar14->_name).super_SQObject._type = SVar4;
  if ((SVar4 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar9->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 + 1;
  }
  if ((SVar3 >> 0x1b & 1) != 0) {
    pSVar1 = &(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._uiRef;
    *pSVar1 = *pSVar1 - 1;
    if (*pSVar1 == 0) {
      (*(pSVar8->super_SQDelegable).super_SQCollectable.super_SQRefCounted._vptr_SQRefCounted[2])();
      src = extraout_RDX;
    }
  }
  if (0 < (long)this->_noutervalues) {
    lVar16 = 8;
    lVar15 = 0;
    do {
      pSVar10 = this->_outervalues;
      pSVar11 = pSVar14->_outervalues;
      uVar5 = *(uint *)((long)pSVar11 + lVar16 + -8);
      plVar12 = *(long **)((long)&(pSVar11->super_SQObject)._type + lVar16);
      lVar13 = *(long *)((long)&(pSVar10->super_SQObject)._type + lVar16);
      *(long *)((long)&(pSVar11->super_SQObject)._type + lVar16) = lVar13;
      uVar6 = *(uint *)((long)pSVar10 + lVar16 + -8);
      src = (EVP_PKEY_CTX *)(ulong)uVar6;
      *(uint *)((long)pSVar11 + lVar16 + -8) = uVar6;
      if ((uVar6 >> 0x1b & 1) != 0) {
        plVar2 = (long *)(lVar13 + 8);
        *plVar2 = *plVar2 + 1;
      }
      if ((uVar5 >> 0x1b & 1) != 0) {
        plVar2 = plVar12 + 1;
        *plVar2 = *plVar2 + -1;
        if (*plVar2 == 0) {
          (**(code **)(*plVar12 + 0x10))();
          src = extraout_RDX_00;
        }
      }
      lVar15 = lVar15 + 1;
      lVar16 = lVar16 + 0x10;
    } while (lVar15 < (long)this->_noutervalues);
  }
  sqvector<long_long>::copy(&pSVar14->_typecheck,(EVP_PKEY_CTX *)&this->_typecheck,src);
  pSVar14->_nparamscheck = this->_nparamscheck;
  return pSVar14;
}

Assistant:

SQNativeClosure *Clone()
    {
        SQNativeClosure * ret = SQNativeClosure::Create(_opt_ss(this),_function,_noutervalues);
        ret->_env = _env;
        if(ret->_env) __ObjAddRef(ret->_env);
        ret->_name = _name;
        _COPY_VECTOR(ret->_outervalues,_outervalues,_noutervalues);
        ret->_typecheck.copy(_typecheck);
        ret->_nparamscheck = _nparamscheck;
        return ret;
    }